

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_circle_node(REF_NODE ref_node)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  double local_b0;
  undefined8 local_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  double local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  REF_DBL m [6];
  
  lVar6 = 2;
  lVar7 = 0;
  do {
    if (ref_node->max <= lVar7) {
      return 0;
    }
    if (-1 < ref_node->global[lVar7]) {
      dVar1 = ref_node->real[lVar6 + -2];
      dVar2 = ref_node->real[lVar6];
      dVar8 = SQRT(dVar1 * dVar1 + dVar2 * dVar2);
      dVar1 = atan2(dVar2,dVar1);
      dVar2 = 1.0 - dVar8;
      if (dVar2 <= -dVar2) {
        dVar2 = -dVar2;
      }
      dVar4 = dVar2 * 1.5 + 0.0005;
      dVar2 = dVar8 * 0.1 + dVar2 * 1.5;
      dVar2 = dVar2 * dVar2;
      auVar3._8_4_ = SUB84(dVar2,0);
      auVar3._0_8_ = dVar4 * dVar4;
      auVar3._12_4_ = (int)((ulong)dVar2 >> 0x20);
      local_c8 = divpd(_DAT_00205d00,auVar3);
      local_b8 = 0x3ff0000000000000;
      local_b0 = cos(dVar1);
      local_a8 = 0;
      local_a0 = sin(dVar1);
      local_98 = sin(dVar1);
      local_98 = -local_98;
      local_90 = 0;
      local_88 = cos(dVar1);
      local_80 = 0;
      uStack_78 = 0x3ff0000000000000;
      local_70 = 0;
      ref_matrix_form_m((REF_DBL *)local_c8,m);
      uVar5 = ref_node_metric_set(ref_node,(REF_INT)lVar7,m);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x181,"ref_metric_circle_node",(ulong)uVar5,"set node met");
        return uVar5;
      }
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0xf;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_circle_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL x, z, r, t;
  REF_DBL hy, h1, h2;
  REF_DBL d[12], m[6];

  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    z = ref_node_xyz(ref_node, 2, node);
    r = sqrt(x * x + z * z);
    t = atan2(z, x);
    hy = 1.0;
    h1 = 0.0005 + 1.5 * ABS(1.0 - r);
    h2 = 0.1 * r + 1.5 * ABS(1.0 - r);
    ref_matrix_eig(d, 0) = 1.0 / (h1 * h1);
    ref_matrix_eig(d, 1) = 1.0 / (h2 * h2);
    ref_matrix_eig(d, 2) = 1.0 / (hy * hy);
    ref_matrix_vec(d, 0, 0) = cos(t);
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = sin(t);
    ref_matrix_vec(d, 0, 1) = -sin(t);
    ref_matrix_vec(d, 1, 1) = 0.0;
    ref_matrix_vec(d, 2, 1) = cos(t);
    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 1.0;
    ref_matrix_vec(d, 2, 2) = 0.0;
    ref_matrix_form_m(d, m);
    RSS(ref_node_metric_set(ref_node, node, m), "set node met");
  }

  return REF_SUCCESS;
}